

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_handlers.c
# Opt level: O0

dropt_error
dropt_handle_double(dropt_context *context,dropt_option *option,dropt_char *optionArgument,
                   void *dest)

{
  int *piVar1;
  double *local_50;
  char *local_48;
  dropt_char *end;
  double *out;
  double val;
  void *pvStack_28;
  dropt_error err;
  void *dest_local;
  dropt_char *optionArgument_local;
  dropt_option *option_local;
  dropt_context *context_local;
  
  val._4_4_ = 0;
  out = (double *)0x0;
  end = (dropt_char *)dest;
  pvStack_28 = dest;
  dest_local = optionArgument;
  optionArgument_local = &option->short_name;
  option_local = (dropt_option *)context;
  if (dest == (void *)0x0) {
    dropt_misuse("No handler destination specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_handlers.c"
                 ,0x179);
    val._4_4_ = 2;
  }
  else if ((optionArgument == (dropt_char *)0x0) || (*optionArgument == '\0')) {
    val._4_4_ = 5;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    out = (double *)strtod((char *)dest_local,&local_48);
    if ((*local_48 == '\0') && (dest_local < local_48)) {
      piVar1 = __errno_location();
      if (*piVar1 == 0x22) {
        if (0.0 <= (double)out) {
          local_50 = out;
        }
        else {
          local_50 = (double *)((ulong)out ^ 0x8000000000000000);
        }
        val._4_4_ = 7;
        if ((double)local_50 <= 2.2250738585072014e-308) {
          val._4_4_ = 8;
        }
      }
      else {
        piVar1 = __errno_location();
        if (*piVar1 != 0) {
          val._4_4_ = 1;
        }
      }
    }
    else {
      val._4_4_ = 6;
    }
  }
  if (val._4_4_ == 0) {
    *(double **)end = out;
  }
  return val._4_4_;
}

Assistant:

dropt_error
dropt_handle_double(dropt_context* context,
                    const dropt_option* option,
                    const dropt_char* optionArgument,
                    void* dest)
{
    dropt_error err = dropt_error_none;
    double val = 0.0;
    double* out = dest;

    if (out == NULL)
    {
        DROPT_MISUSE("No handler destination specified.");
        err = dropt_error_bad_configuration;
    }
    else if (   optionArgument == NULL
             || optionArgument[0] == DROPT_TEXT_LITERAL('\0'))
    {
        err = dropt_error_insufficient_arguments;
    }
    else
    {
        dropt_char* end;
        errno = 0;
        val = dropt_strtod(optionArgument, &end);

        /* Check that we matched at least one digit.
         * (`strtod` will return 0 if fed a string with no digits.)
         */
        if (*end == DROPT_TEXT_LITERAL('\0') && end > optionArgument)
        {
            if (errno == ERANGE)
            {
                /* Note that setting `errno` to `ERANGE` for underflow errors
                 * is implementation-defined behavior, but glibc, BSD's
                 * libc, and Microsoft's CRT all have implementations of
                 * `strtod` documented to return 0 and to set `errno` to
                 * `ERANGE` for such cases.
                 */
                err = (ABS(val) <= DBL_MIN)
                      ? dropt_error_underflow
                      : dropt_error_overflow;
            }
            else if (errno != 0)
            {
                err = dropt_error_unknown;
            }
        }
        else
        {
            err = dropt_error_mismatch;
        }
    }

    if (err == dropt_error_none) { *out = val; }
    return err;
}